

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prng_generate(prng_impl *pi,void *outbuf)

{
  ssh_hash *h_00;
  BignumInt BVar1;
  BignumDblInt ADC_temp;
  ulong uStack_30;
  uint i_1;
  BignumCarry c;
  uint i;
  ssh_hash *h;
  void *outbuf_local;
  prng_impl *pi_local;
  
  h_00 = ssh_hash_copy(pi->generator);
  BinarySink_put_byte(h_00->binarysink_,'G');
  for (c._4_4_ = 0; c._4_4_ < 0x80; c._4_4_ = c._4_4_ + 8) {
    BinarySink_put_byte(h_00->binarysink_,
                        (uchar)(pi->counter[c._4_4_ >> 6] >> ((byte)c._4_4_ & 0x3f)));
  }
  uStack_30 = 1;
  for (ADC_temp._12_4_ = 0; ADC_temp._12_4_ < 2; ADC_temp._12_4_ = ADC_temp._12_4_ + 1) {
    BVar1 = pi->counter[ADC_temp._12_4_] + uStack_30;
    uStack_30 = (ulong)CARRY8(pi->counter[ADC_temp._12_4_],uStack_30);
    pi->counter[ADC_temp._12_4_] = BVar1;
  }
  ssh_hash_final(h_00,(uchar *)outbuf);
  return;
}

Assistant:

static inline void prng_generate(prng_impl *pi, void *outbuf)
{
    ssh_hash *h = ssh_hash_copy(pi->generator);

    prngdebug("prng_generate\n");
    put_byte(h, 'G');
    for (unsigned i = 0; i < 128; i += 8)
        put_byte(h, pi->counter[i/BIGNUM_INT_BITS] >> (i%BIGNUM_INT_BITS));
    BignumCarry c = 1;
    for (unsigned i = 0; i < lenof(pi->counter); i++)
        BignumADC(pi->counter[i], c, pi->counter[i], 0, c);
    ssh_hash_final(h, outbuf);
}